

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

void __thiscall
LowererMD::EmitExtractInt64(LowererMD *this,Opnd *dst,Opnd *src,uint index,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  IntConstOpnd *pIVar5;
  Instr *pIVar6;
  Opnd *src1Opnd;
  Instr *tmpInstr;
  Opnd *tmp;
  Instr *instr_local;
  uint index_local;
  Opnd *src_local;
  Opnd *dst_local;
  LowererMD *this_local;
  
  if ((index != 0) && (index != 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,600,"(index == 0 || index == 1)","index == 0 || index == 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Opnd::IsInt64(dst);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsSimd128(src), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x259,"(dst->IsInt64() && src->IsSimd128())",
                       "dst->IsInt64() && src->IsSimd128()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
  if (BVar3 == 0) {
    tmpInstr = (Instr *)src;
    if (index != 0) {
      tmpInstr = (Instr *)IR::RegOpnd::New(TySimd128F4,this->m_func);
      pIVar5 = IR::IntConstOpnd::New(0xe,TyInt8,this->m_func,true);
      pIVar6 = IR::Instr::New(PSHUFD,(Opnd *)tmpInstr,src,&pIVar5->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar6);
    }
    src1Opnd = IR::Opnd::UseWithNewType((Opnd *)tmpInstr,TyFloat64,this->m_func);
    pIVar6 = IR::Instr::New(Simd128_ExtractLane_I2,dst,src1Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    Lowerer::LowerReinterpretPrimitive(this->m_lowerer,pIVar6);
  }
  else {
    pIVar5 = IR::IntConstOpnd::New((ulong)index,TyInt8,this->m_func,true);
    pIVar6 = IR::Instr::New(PEXTRQ,dst,src,&pIVar5->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
  }
  return;
}

Assistant:

void LowererMD::EmitExtractInt64(IR::Opnd* dst, IR::Opnd* src, uint index, IR::Instr *instr)
{
    Assert(index == 0 || index == 1);
    Assert(dst->IsInt64() && src->IsSimd128());
    if (AutoSystemInfo::Data.SSE4_1Available())
    {
#ifdef _M_IX86
        index *= 2;
        Int64RegPair dstPair = m_func->FindOrCreateInt64Pair(dst);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PEXTRD, dstPair.low, src, IR::IntConstOpnd::New(index, TyInt8, m_func, true), m_func));
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PEXTRD, dstPair.high, src, IR::IntConstOpnd::New(index + 1, TyInt8, m_func, true), m_func));
#else
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PEXTRQ, dst, src, IR::IntConstOpnd::New(index, TyInt8, m_func, true), m_func));
#endif
    }
    else
    {
        IR::Opnd* tmp = src;
        if (index)
        {
            tmp = IR::RegOpnd::New(TySimd128F4, m_func);
            instr->InsertBefore(IR::Instr::New(Js::OpCode::PSHUFD, tmp, src, IR::IntConstOpnd::New(2 | 3 << 2, TyInt8, m_func, true), m_func));
        }
        //kludg-ish; we need a new instruction for LowerReinterpretPrimitive to transform 
        //and dummy one for a caller to remove 
        IR::Instr* tmpInstr = IR::Instr::New(Js::OpCode::Simd128_ExtractLane_I2, dst, tmp->UseWithNewType(TyFloat64, m_func), m_func);
        instr->InsertBefore(tmpInstr);
        m_lowerer->LowerReinterpretPrimitive(tmpInstr);
    }
}